

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O1

lys_module * lyd_node_module(lyd_node *node)

{
  int iVar1;
  lysc_node *plVar2;
  lys_module *plVar3;
  
  while( true ) {
    if ((lyd_node_inner *)node == (lyd_node_inner *)0x0) {
      return (lys_module *)0x0;
    }
    plVar2 = (((lyd_node_inner *)node)->field_0).node.schema;
    if (plVar2 != (lysc_node *)0x0) break;
    iVar1 = *(int *)((long)&((lyd_node_inner *)((long)node + 0x48))->field_0 + 0x1c);
    if (iVar1 == 4) {
      plVar2 = (((lyd_node_inner *)((long)node + 0x48))->field_0).node.schema;
      if (plVar2 != (lysc_node *)0x0) {
        plVar3 = ly_ctx_get_module_implemented
                           ((ly_ctx *)(((lyd_node_inner *)((long)node + 0x48))->field_0).node.priv,
                            (char *)plVar2);
        return plVar3;
      }
    }
    else if ((iVar1 == 3) &&
            (plVar2 = (((lyd_node_inner *)((long)node + 0x48))->field_0).node.schema,
            plVar2 != (lysc_node *)0x0)) {
      plVar3 = ly_ctx_get_module_implemented_ns
                         ((ly_ctx *)(((lyd_node_inner *)((long)node + 0x48))->field_0).node.priv,
                          (char *)plVar2);
      return plVar3;
    }
    node = (lyd_node *)(((lyd_node_inner *)node)->field_0).node.parent;
  }
  return plVar2->module;
}

Assistant:

lys_module *
lyd_node_module(const struct lyd_node *node)
{
    const struct lyd_node_opaq *opaq;

    while (node) {
        /* data node */
        if (node->schema) {
            return node->schema->module;
        }

        /* opaque node */
        opaq = (struct lyd_node_opaq *)node;
        switch (opaq->format) {
        case LY_VALUE_XML:
            if (opaq->name.module_ns) {
                return ly_ctx_get_module_implemented_ns(LYD_CTX(node), opaq->name.module_ns);
            }
            break;
        case LY_VALUE_JSON:
            if (opaq->name.module_name) {
                return ly_ctx_get_module_implemented(LYD_CTX(node), opaq->name.module_name);
            }
            break;
        default:
            break;
        }

        node = lyd_parent(node);
    }

    return NULL;
}